

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void sarimax_summary(sarimax_object obj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  
  iVar9 = obj->q;
  iVar1 = obj->p;
  iVar2 = obj->P;
  iVar3 = obj->Q;
  iVar4 = obj->M;
  iVar5 = obj->r;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    uVar6 = obj->retval;
    if (((ulong)uVar6 < 0x10) && ((0x9493U >> (uVar6 & 0x1f) & 1) != 0)) {
      printf((&PTR_anon_var_dwarf_7e0_00158d10)[uVar6]);
    }
  }
  puts("\n");
  iVar10 = 0;
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)obj->p,
         (ulong)(uint)obj->d,(ulong)(uint)obj->q,(ulong)(uint)obj->P,(ulong)(uint)obj->D,obj->Q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  iVar9 = iVar9 + iVar1 + iVar2 + iVar3 + iVar4 + 1;
  for (lVar11 = 0; lVar11 < obj->p; lVar11 = lVar11 + 1) {
    dVar13 = obj->phi[lVar11];
    if (obj->vcov[iVar10] < 0.0) {
      sqrt(obj->vcov[iVar10]);
    }
    printf("AR%-15d%-20g%-20g \n",dVar13,(ulong)((int)lVar11 + 1));
    iVar10 = iVar10 + iVar9;
  }
  for (lVar11 = 0; lVar11 < obj->q; lVar11 = lVar11 + 1) {
    dVar13 = obj->theta[lVar11];
    if (obj->vcov[(obj->p + (int)lVar11) * iVar9] < 0.0) {
      sqrt(obj->vcov[(obj->p + (int)lVar11) * iVar9]);
    }
    printf("MA%-15d%-20g%-20g \n",dVar13,(ulong)((int)lVar11 + 1));
  }
  for (lVar11 = 0; lVar11 < obj->P; lVar11 = lVar11 + 1) {
    dVar13 = obj->PHI[lVar11];
    if (obj->vcov[(obj->p + obj->q + (int)lVar11) * iVar9] < 0.0) {
      sqrt(obj->vcov[(obj->p + obj->q + (int)lVar11) * iVar9]);
    }
    printf("SAR%-14d%-20g%-20g \n",dVar13,(ulong)((int)lVar11 + 1));
  }
  for (lVar11 = 0; lVar11 < obj->Q; lVar11 = lVar11 + 1) {
    dVar13 = obj->THETA[lVar11];
    if (obj->vcov[(obj->p + obj->q + obj->P + (int)lVar11) * iVar9] < 0.0) {
      sqrt(obj->vcov[(obj->p + obj->q + obj->P + (int)lVar11) * iVar9]);
    }
    printf("SMA%-14d%-20g%-20g \n",dVar13,(ulong)((int)lVar11 + 1));
  }
  putchar(10);
  if (iVar5 < iVar4) {
    dVar13 = obj->mean;
    if (obj->vcov[(obj->q + obj->p + obj->P + obj->Q) * iVar9] < 0.0) {
      sqrt(obj->vcov[(obj->q + obj->p + obj->P + obj->Q) * iVar9]);
    }
    printf("%-17s%-20g%-20g \n",dVar13,"MEAN");
    for (lVar11 = 1; lVar11 <= obj->r; lVar11 = lVar11 + 1) {
      dVar13 = obj->exog[lVar11 + -1];
      if (obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11) * iVar9] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11) * iVar9]);
      }
      printf("%-17s%-20g%-20g \n",dVar13,"EXOG");
    }
  }
  else {
    for (lVar11 = 0; lVar11 < obj->r; lVar11 = lVar11 + 1) {
      dVar13 = obj->exog[lVar11];
      if (obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11) * iVar9] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11) * iVar9]);
      }
      printf("%-17s%-20g%-20g \n",dVar13,"EXOG");
    }
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_00158d90 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if ((ulong)(uint)obj->optmethod < 8) {
    printf((&PTR_anon_var_dwarf_959_00158da8)[(uint)obj->optmethod]);
  }
  puts("\n");
  uVar12 = 0;
  printf("EQUATION FORM : x[t] ");
  while ((long)uVar12 < (long)obj->p) {
    dVar13 = obj->phi[uVar12];
    if (dVar13 <= 0.0) {
      if (dVar13 < 0.0) {
        dVar13 = ABS(dVar13);
        pcVar8 = "+ %g*x[t - %d%s";
        pcVar7 = "] ";
        goto LAB_0010f149;
      }
      uVar12 = uVar12 + 1;
    }
    else {
      pcVar8 = "- %g*x[t - %d%s";
      pcVar7 = "]";
LAB_0010f149:
      uVar12 = uVar12 + 1;
      printf(pcVar8,dVar13,uVar12 & 0xffffffff,pcVar7);
    }
  }
  putchar(0x3d);
  if ((obj->mean != 0.0) || (NAN(obj->mean))) {
    printf(" %g +");
  }
  uVar12 = 0;
  printf(" a[t] ");
LAB_0010f1ac:
  do {
    if ((long)obj->q <= (long)uVar12) break;
    dVar13 = obj->theta[uVar12];
    if (0.0 < dVar13) {
      pcVar8 = "- %g*a[t - %d%s";
      pcVar7 = "]";
    }
    else {
      if (0.0 < obj->phi[uVar12] || obj->phi[uVar12] == 0.0) {
        uVar12 = uVar12 + 1;
        goto LAB_0010f1ac;
      }
      dVar13 = ABS(dVar13);
      pcVar8 = "+ %g*a[t - %d%s";
      pcVar7 = "] ";
    }
    uVar12 = uVar12 + 1;
    printf(pcVar8,dVar13,uVar12 & 0xffffffff,pcVar7);
  } while( true );
  puts("\n");
  if ((uint)obj->method < 3) {
    printf("Log Likelihood : %g ",obj->loglik);
    puts("\n");
    if ((uint)obj->method < 2) {
      printf("AIC criterion : %g ",obj->aic);
      goto LAB_0010f265;
    }
  }
  printf("AIC Criterion : Unavailable ");
LAB_0010f265:
  puts("\n");
  return;
}

Assistant:

void sarimax_summary(sarimax_object obj) {
	int i, pq,t,nd,ncxreg,mean;
	pq = obj->p + obj->q + obj->P + obj->Q + obj->M;
	mean = obj->M - obj->r;
	
	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->p,obj->d,obj->q, obj->P,obj->D,obj->Q );
	printf("\n");
	//mdisplay(obj->vcov,pq,pq);
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i], sqrt(obj->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->P; ++i) {
		t = obj->p + obj->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->PHI[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->Q; ++i) {
		t = obj->p + obj->q + obj->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->THETA[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q + obj->P + obj->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
		for(i = 1; i <= obj->r; ++i) {
			t = obj->p + obj->q + obj->P + obj->Q + i;
			printf("%-17s%-20g%-20g \n", "EXOG", obj->exog[i-1], sqrt(obj->vcov[t + pq * t]));
		}
	}
	else {
		for(i = 0; i < obj->r; ++i) {
			t = obj->p + obj->q + obj->P + obj->Q + i;
			printf("%-17s%-20g%-20g \n", "EXOG", obj->exog[i], sqrt(obj->vcov[t + pq * t]));
		}
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->method == 1) {
		printf("MLE");
	}
	else if (obj->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	printf("EQUATION FORM : x[t] ");
	for (i = 0; i < obj->p; ++i) {
		if (obj->phi[i] > 0) {
			printf("- %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "] ");
		}
	}

	printf("=");
	if (obj->mean != 0.0) {
		printf(" %g +", obj->mean);
	}
	printf(" a[t] ");
	for (i = 0; i < obj->q; ++i) {
		if (obj->theta[i] > 0) {
			printf("- %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "] ");
		}
	}
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1 || obj->method == 2) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	if (obj->method == 0 || obj->method == 1) {
		printf("AIC criterion : %g ", obj->aic);
		printf("\n\n");
	}
	else {
		printf("AIC Criterion : Unavailable ");
		printf("\n\n");
	}
}